

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lzop.c
# Opt level: O0

int archive_write_lzop_open(archive_write_filter *f)

{
  int iVar1;
  long in_RDI;
  int r;
  archive_string as;
  write_lzop *data;
  undefined7 in_stack_ffffffffffffffc8;
  char in_stack_ffffffffffffffcf;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  archive_write_filter *f_00;
  archive_string *as_00;
  
  as_00 = *(archive_string **)(in_RDI + 0x40);
  f_00 = (archive_write_filter *)0x0;
  archive_strncat(as_00,(void *)0x0,0);
  if (0 < *(int *)&as_00->s) {
    archive_strappend_char
              ((archive_string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcf);
    archive_strappend_char
              ((archive_string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcf);
    archive_strappend_char
              ((archive_string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcf);
  }
  iVar1 = __archive_write_program_open
                    (f_00,(archive_write_program_data *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     (char *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  archive_string_free((archive_string *)0x2903c6);
  return iVar1;
}

Assistant:

static int
archive_write_lzop_open(struct archive_write_filter *f)
{
	struct write_lzop *data = (struct write_lzop *)f->data;
	struct archive_string as;
	int r;

	archive_string_init(&as);
	archive_strcpy(&as, "lzop");
	/* Specify compression level. */
	if (data->compression_level > 0) {
		archive_strappend_char(&as, ' ');
		archive_strappend_char(&as, '-');
		archive_strappend_char(&as, '0' + data->compression_level);
	}

	r = __archive_write_program_open(f, data->pdata, as.s);
	archive_string_free(&as);
	return (r);
}